

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitAt(VerySimpleReadOnlyString *this,int pos,int stripFromRet)

{
  tCharPtr _data;
  int _length;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  VerySimpleReadOnlyString *this_00;
  VerySimpleReadOnlyString VVar2;
  int local_20;
  int stripFromRet_local;
  int pos_local;
  VerySimpleReadOnlyString *this_local;
  VerySimpleReadOnlyString *ret;
  
  this_00 = (VerySimpleReadOnlyString *)CONCAT44(in_register_00000034,pos);
  local_20 = in_ECX;
  if (stripFromRet < in_ECX) {
    local_20 = stripFromRet;
  }
  if (stripFromRet < 0) {
    VerySimpleReadOnlyString(this,(tCharPtr)0x0,-1);
    uVar1 = extraout_RDX;
  }
  else {
    _data = this_00->data;
    _length = min<int>(stripFromRet - local_20,this_00->length);
    VerySimpleReadOnlyString(this,_data,_length);
    if (this_00->length < stripFromRet) {
      Mutate(this_00,this_00->data,0);
      uVar1 = extraout_RDX_00;
    }
    else {
      Mutate(this_00,this_00->data + stripFromRet,this_00->length - stripFromRet);
      uVar1 = extraout_RDX_01;
    }
  }
  VVar2._8_8_ = uVar1;
  VVar2.data = (tCharPtr)this;
  return VVar2;
}

Assistant:

VerySimpleReadOnlyString VerySimpleReadOnlyString::splitAt(int pos, int stripFromRet)
    {
        if (stripFromRet > pos) stripFromRet = pos;
        if (pos < 0) return VerySimpleReadOnlyString();
        VerySimpleReadOnlyString ret(data, min(pos - stripFromRet, length));
        if (pos > length) (void)Mutate(data, 0);
        else (void)Mutate(data + pos, length - pos);
        return ret;
    }